

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen10Texture.cpp
# Opt level: O2

void __thiscall
GmmLib::GmmGen10TextureCalc::GetMipTailGeometryOffset
          (GmmGen10TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t MipLevel,uint32_t *OffsetX,
          uint32_t *OffsetY,uint32_t *OffsetZ)

{
  GMM_RESOURCE_TYPE GVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  anon_struct_8_44_94931171_for_Info aVar4;
  uint uVar5;
  GMM_MIPTAIL_SLOT_OFFSET (*paGVar6) [5];
  uint uVar7;
  long lVar8;
  
  if ((((((this->super_GmmGen9TextureCalc).super_GmmTextureCalc.pGmmLibContext)->SkuTable).field_1.
        field_0x1 & 0x80) == 0) || (GVar1 = pTexInfo->Type, GVar1 == RESOURCE_3D)) {
    GmmGen9TextureCalc::GetMipTailGeometryOffset
              (&this->super_GmmGen9TextureCalc,pTexInfo,MipLevel,OffsetX,OffsetY,OffsetZ);
    return;
  }
  uVar2 = pTexInfo->BitsPerPixel;
  uVar7 = uVar2 << 0x1d | uVar2 - 8 >> 3;
  if (uVar7 < 8) {
    lVar8 = *(long *)(&DAT_001c8250 + (ulong)uVar7 * 8);
  }
  else {
    lVar8 = 0;
  }
  if ((GVar1 != RESOURCE_CUBE) && (GVar1 != RESOURCE_2D)) {
    if (GVar1 != RESOURCE_1D) {
      return;
    }
    uVar7 = (SUB84((pTexInfo->Flags).Info,4) >> 3 & 4) +
            (MipLevel - (pTexInfo->Alignment).MipTailStartLod);
    paGVar6 = Gen10MipTailSlotOffset1DSurface;
    goto LAB_001b29a5;
  }
  aVar4 = (pTexInfo->Flags).Info;
  if (((ulong)aVar4 >> 0x26 & 1) == 0) {
    if (((ulong)aVar4 >> 0x25 & 1) != 0) {
      uVar5 = (pTexInfo->MSAA).NumSamples - 2;
      uVar7 = uVar5 >> 1;
      uVar5 = uVar7 | (uint)((uVar5 & 1) != 0) << 0x1f;
      if ((uVar5 < 8) && ((0x8bU >> (uVar7 & 0x1f) & 1) != 0)) {
        uVar7 = *(uint *)(&DAT_001c8290 + (ulong)uVar5 * 4);
        goto LAB_001b2997;
      }
    }
    uVar7 = aVar4._4_4_ >> 3 & 4;
  }
  else {
    uVar3 = (pTexInfo->MSAA).NumSamples;
    if (uVar3 == 4) {
      uVar7 = 2;
    }
    else if (uVar3 == 8) {
      uVar7 = 3;
    }
    else if (uVar3 == 0x10) {
      uVar7 = 4;
    }
    else {
      uVar7 = (uint)(uVar3 == 2);
    }
  }
LAB_001b2997:
  uVar7 = (MipLevel - (pTexInfo->Alignment).MipTailStartLod) + uVar7;
  paGVar6 = Gen10MipTailSlotOffset2DSurface;
LAB_001b29a5:
  *OffsetX = uVar2 * paGVar6[uVar7][lVar8].X >> 3;
  *OffsetY = paGVar6[uVar7][lVar8].Y;
  *OffsetZ = paGVar6[uVar7][lVar8].Z;
  return;
}

Assistant:

void GmmLib::GmmGen10TextureCalc::GetMipTailGeometryOffset(GMM_TEXTURE_INFO *pTexInfo,
                                                           uint32_t          MipLevel,
                                                           uint32_t *        OffsetX,
                                                           uint32_t *        OffsetY,
                                                           uint32_t *        OffsetZ)
{
    uint32_t ArrayIndex = 0;
    uint32_t Slot       = 0;

    GMM_DPF_ENTER;

    // 3D textures follow the Gen9 mip tail format
    if(!pGmmLibContext->GetSkuTable().FtrStandardMipTailFormat ||
       pTexInfo->Type == RESOURCE_3D)
    {
        return GmmGen9TextureCalc::GetMipTailGeometryOffset(pTexInfo, MipLevel, OffsetX, OffsetY, OffsetZ);
    }

    switch(pTexInfo->BitsPerPixel)
    {
        case 128:
            ArrayIndex = 0;
            break;
        case 64:
            ArrayIndex = 1;
            break;
        case 32:
            ArrayIndex = 2;
            break;
        case 16:
            ArrayIndex = 3;
            break;
        case 8:
            ArrayIndex = 4;
            break;
        default:
            __GMM_ASSERT(0);
            break;
    }

    if(pTexInfo->Type == RESOURCE_1D)
    {
        Slot = MipLevel - pTexInfo->Alignment.MipTailStartLod +
               (pTexInfo->Flags.Info.TiledYf ? 4 : 0);

        *OffsetX = Gen10MipTailSlotOffset1DSurface[Slot][ArrayIndex].X * pTexInfo->BitsPerPixel / 8;
        *OffsetY = Gen10MipTailSlotOffset1DSurface[Slot][ArrayIndex].Y;
        *OffsetZ = Gen10MipTailSlotOffset1DSurface[Slot][ArrayIndex].Z;
    }
    else if(pTexInfo->Type == RESOURCE_2D || pTexInfo->Type == RESOURCE_CUBE)
    {
        // clang-format off
        Slot = MipLevel - pTexInfo->Alignment.MipTailStartLod +
               // TileYs
               ((pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples == 16) ? 4 :
               (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples == 8) ? 3 :
               (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples == 4) ? 2 :
               (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples == 2) ? 1 :
               (pTexInfo->Flags.Info.TiledYs) ? 0 :
               // TileYf
               (pTexInfo->Flags.Info.TiledYf && pTexInfo->MSAA.NumSamples == 16) ? 11 :
               (pTexInfo->Flags.Info.TiledYf && pTexInfo->MSAA.NumSamples == 8) ? 10 :
               (pTexInfo->Flags.Info.TiledYf && pTexInfo->MSAA.NumSamples == 4) ? 8 :
               (pTexInfo->Flags.Info.TiledYf && pTexInfo->MSAA.NumSamples == 2) ? 5 :
               (pTexInfo->Flags.Info.TiledYf) ? 4 : 0);
        // clang-format on

        *OffsetX = Gen10MipTailSlotOffset2DSurface[Slot][ArrayIndex].X * pTexInfo->BitsPerPixel / 8;
        *OffsetY = Gen10MipTailSlotOffset2DSurface[Slot][ArrayIndex].Y;
        *OffsetZ = Gen10MipTailSlotOffset2DSurface[Slot][ArrayIndex].Z;
    }

    GMM_DPF_EXIT;
    return;
}